

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

_Bool mi_manage_os_memory_ex
                (void *start,size_t size,_Bool is_committed,_Bool is_large,_Bool is_zero,
                int numa_node,_Bool exclusive,mi_arena_id_t *arena_id)

{
  mi_memid_t memid_00;
  _Bool _Var1;
  mi_memid_t memid;
  undefined8 local_8;
  
  local_8 = CONCAT53(0x100,CONCAT12(is_zero,(short)CONCAT61(0x10000,is_committed) << 8));
  memid_00.is_pinned = is_large;
  memid_00.initially_committed = (_Bool)local_8._1_1_;
  memid_00.initially_zero = (_Bool)local_8._2_1_;
  memid_00._19_1_ = local_8._3_1_;
  memid_00.memkind = local_8._4_4_;
  memid_00.mem = (anon_union_16_2_8cef793c_for_mem)ZEXT816(0);
  _Var1 = mi_manage_os_memory_ex2(start,size,is_large,numa_node,exclusive,memid_00,arena_id);
  return _Var1;
}

Assistant:

bool mi_manage_os_memory_ex(void* start, size_t size, bool is_committed, bool is_large, bool is_zero, int numa_node, bool exclusive, mi_arena_id_t* arena_id) mi_attr_noexcept {
  mi_memid_t memid = _mi_memid_create(MI_MEM_EXTERNAL);
  memid.initially_committed = is_committed;
  memid.initially_zero = is_zero;
  memid.is_pinned = is_large;
  return mi_manage_os_memory_ex2(start,size,is_large,numa_node,exclusive,memid, arena_id);
}